

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Bucket * __thiscall
Lib::
Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
::insert(Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
         *this,uint *key,Bucket *val,uint code)

{
  MaybeUninit<unsigned_int> MVar1;
  Entry *pEVar2;
  Bucket BStack_58;
  
  pEVar2 = this->_entries + (ulong)code % (ulong)(uint)this->_capacity;
  while (pEVar2->code != 0) {
    if ((pEVar2->code == code) && (pEVar2->_key == (MaybeUninit<unsigned_int>)*key))
    goto LAB_004bb941;
    pEVar2 = pEVar2 + 1;
    if (pEVar2 == this->_afterLast) {
      pEVar2 = this->_entries;
    }
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  MVar1 = (MaybeUninit<unsigned_int>)*key;
  Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
  Bucket::Bucket(&BStack_58,val);
  pEVar2->_key = MVar1;
  Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
  Bucket::Bucket((Bucket *)&(pEVar2->_value).__align,&BStack_58);
  pEVar2->code = code;
  Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
  Bucket::~Bucket(&BStack_58);
LAB_004bb941:
  return (Bucket *)&pEVar2->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }